

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  type_info *__rhs;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  PyObject **ppPVar5;
  undefined8 uVar6;
  char *pcVar7;
  reference pvVar8;
  type_info *ptVar9;
  PyMethodDef *pPVar10;
  _func_void_void_ptr *destructor;
  PyObject *pPVar11;
  size_t sVar12;
  PyObject *pPVar13;
  PyTypeObject *type;
  PyTypeObject *local_720;
  byte local_6a1;
  char *local_698;
  PyCFunctionObject *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  handle local_640;
  function_record *it;
  string local_630 [3];
  bool first_user_def;
  int index;
  string signatures;
  capsule local_608;
  capsule rec_capsule_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  str_attr_accessor local_5d8;
  str local_5b8;
  string local_5b0;
  allocator<char> local_589;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  str_attr_accessor local_4a8;
  object local_488;
  PyObject *local_480;
  str_attr_accessor local_478;
  object local_458;
  PyObject *local_450;
  handle local_448;
  object scope_module;
  handle local_438;
  capsule rec_capsule_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  handle local_3c8;
  capsule local_3c0;
  capsule rec_capsule;
  function_record *chain_start;
  function_record *chain;
  allocator<char> local_399;
  undefined1 local_398 [8];
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  str_attr_accessor local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  str_attr_accessor local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  str_attr_accessor local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  handle local_1f8;
  handle th;
  type_info *tinfo;
  type_info *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  char local_191;
  char *pcStack_190;
  char c;
  char *pc;
  size_t arg_index;
  size_t type_index;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string func_name;
  string class_name;
  str local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  size_t args_local;
  type_info **types_local;
  char *text_local;
  function_record *rec_local;
  cpp_function *this_local;
  
  if (rec->name == (char *)0x0) {
    local_698 = "";
  }
  else {
    local_698 = rec->name;
  }
  pcVar4 = strdup(local_698);
  rec->name = pcVar4;
  if (rec->doc != (char *)0x0) {
    pcVar4 = strdup(rec->doc);
    rec->doc = pcVar4;
  }
  __end2 = std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin(&rec->args);
  a = (argument_record *)
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::end(&rec->args);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                     *)&a), bVar2) {
    local_50 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end2);
    if (*(long *)local_50 != 0) {
      pcVar4 = strdup(*(char **)local_50);
      *(char **)local_50 = pcVar4;
    }
    if (*(long *)(local_50 + 8) == 0) {
      bVar2 = handle::operator_cast_to_bool((handle *)(local_50 + 0x10));
      if (bVar2) {
        repr((pybind11 *)&local_78,*(PyObject **)(local_50 + 0x10));
        object::cast<std::__cxx11::string>(&local_70,(object *)&local_78);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pcVar4 = strdup(pcVar4);
        *(char **)(local_50 + 8) = pcVar4;
        std::__cxx11::string::~string((string *)&local_70);
        str::~str(&local_78);
      }
    }
    else {
      pcVar4 = strdup(*(char **)(local_50 + 8));
      *(char **)(local_50 + 8) = pcVar4;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&__end2);
  }
  iVar3 = strcmp(rec->name,"__init__");
  local_6a1 = 1;
  if (iVar3 != 0) {
    iVar3 = strcmp(rec->name,"__setstate__");
    local_6a1 = iVar3 != 0 ^ 0xff;
  }
  *(ushort *)&rec->field_0x59 = *(ushort *)&rec->field_0x59 & 0xfffe | (ushort)(local_6a1 & 1);
  if (((*(ushort *)&rec->field_0x59 & 1) != 0) && ((*(ushort *)&rec->field_0x59 >> 1 & 1) == 0)) {
    ppPVar5 = handle::ptr(&rec->scope);
    detail::get_fully_qualified_tp_name_abi_cxx11_
              ((string *)((long)&func_name.field_2 + 8),(detail *)*ppPVar5,type);
    pcVar4 = rec->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,pcVar4,&local_d1);
    std::allocator<char>::~allocator(&local_d1);
    uVar1 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&func_name.field_2 + 8));
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"\' is using an old-style placement-new \'");
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    std::operator+(&local_f8,&local_118,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    uVar6 = std::__cxx11::string::c_str();
    PyErr_WarnEx(uVar1,uVar6,0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)(func_name.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&type_index);
  arg_index = 0;
  pc = (char *)0x0;
  for (pcStack_190 = text; pcVar4 = pc, *pcStack_190 != '\0'; pcStack_190 = pcStack_190 + 1) {
    local_191 = *pcStack_190;
    if (local_191 == '{') {
      if (pcStack_190[1] != '*') {
        if ((rec->nargs_kw_only != 0) && (pc + rec->nargs_kw_only == (char *)args)) {
          std::__cxx11::string::operator+=((string *)&type_index,"*, ");
        }
        pcVar4 = pc;
        pcVar7 = (char *)std::
                         vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ::size(&rec->args);
        if ((pcVar4 < pcVar7) &&
           (pvVar8 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[](&rec->args,(size_type)pc), *(long *)pvVar8 != 0)) {
          pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,(size_type)pc);
          std::__cxx11::string::operator+=((string *)&type_index,*(char **)pvVar8);
        }
        else if ((pc == (char *)0x0) && ((*(ushort *)&rec->field_0x59 >> 4 & 1) != 0)) {
          std::__cxx11::string::operator+=((string *)&type_index,"self");
        }
        else {
          std::__cxx11::to_string
                    ((string *)&t,(long)pc - (ulong)((*(ushort *)&rec->field_0x59 >> 4 & 1) != 0));
          std::operator+(&local_1b8,"arg",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&t);
        }
        std::__cxx11::string::operator+=((string *)&type_index,": ");
      }
    }
    else if (local_191 == '}') {
      pcVar7 = (char *)std::
                       vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ::size(&rec->args);
      if ((pcVar4 < pcVar7) &&
         (pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,(size_type)pc), *(long *)(pvVar8 + 8) != 0)) {
        std::__cxx11::string::operator+=((string *)&type_index," = ");
        pvVar8 = std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::operator[](&rec->args,(size_type)pc);
        std::__cxx11::string::operator+=((string *)&type_index,*(char **)(pvVar8 + 8));
      }
      if ((rec->nargs_pos_only != 0) && (pc + 1 == (char *)(ulong)rec->nargs_pos_only)) {
        std::__cxx11::string::operator+=((string *)&type_index,", /");
      }
      pc = pc + 1;
    }
    else if (local_191 == '%') {
      __rhs = types[arg_index];
      if (__rhs == (type_info *)0x0) {
        arg_index = arg_index + 1;
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      arg_index = arg_index + 1;
      std::type_index::type_index((type_index *)&th,__rhs);
      ptVar9 = detail::get_type_info((type_index *)&th,false);
      if (ptVar9 == (type_info *)0x0) {
        if (((*(ushort *)&rec->field_0x59 >> 1 & 1) == 0) || (pc != (char *)0x0)) {
          pcVar4 = std::type_info::name(__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_398,pcVar4,&local_399);
          std::allocator<char>::~allocator(&local_399);
          detail::clean_type_id((string *)local_398);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)local_398);
          std::__cxx11::string::~string((string *)local_398);
        }
        else {
          detail::object_api<pybind11::handle>::attr
                    (&local_338,(object_api<pybind11::handle> *)&rec->scope,"__module__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_318,&local_338);
          std::operator+(&local_2f8,&local_318,".");
          detail::object_api<pybind11::handle>::attr
                    ((str_attr_accessor *)((long)&tname.field_2 + 8),
                     (object_api<pybind11::handle> *)&rec->scope,"__qualname__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_358,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)
                     ((long)&tname.field_2 + 8));
          std::operator+(&local_2d8,&local_2f8,&local_358);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_358);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                     ((long)&tname.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_338);
        }
      }
      else {
        handle::handle(&local_1f8,(PyObject *)ptVar9->type);
        detail::object_api<pybind11::handle>::attr
                  (&local_278,(object_api<pybind11::handle> *)&local_1f8,"__module__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_258,&local_278);
        std::operator+(&local_238,&local_258,".");
        detail::object_api<pybind11::handle>::attr
                  (&local_2b8,(object_api<pybind11::handle> *)&local_1f8,"__qualname__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_298,&local_2b8);
        std::operator+(&local_218,&local_238,&local_298);
        std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_298);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2b8);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_278);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&type_index,local_191);
    }
  }
  if ((pc == (char *)args) && (types[arg_index] == (type_info *)0x0)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    rec->signature = pcVar4;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit(&rec->args);
    rec->nargs = (uint16_t)args;
    bVar2 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar2) {
      ppPVar5 = handle::ptr(&rec->sibling);
      iVar3 = _Py_IS_TYPE(*ppPVar5,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar3 != 0) {
        ppPVar5 = handle::ptr(&rec->sibling);
        handle::handle((handle *)&chain,(PyObject *)(*ppPVar5)[1].ob_refcnt);
        (rec->sibling).m_ptr = (PyObject *)chain;
      }
    }
    chain_start = (function_record *)0x0;
    rec_capsule.super_object.super_handle.m_ptr = (object)(object)rec;
    bVar2 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar2) {
      ppPVar5 = handle::ptr(&rec->sibling);
      iVar3 = _PyObject_TypeCheck(*ppPVar5,(PyTypeObject *)&PyCFunction_Type);
      if (iVar3 == 0) {
        bVar2 = detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)&rec->sibling);
        if ((!bVar2) && (*rec->name != '_')) {
          pcVar4 = rec->name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,pcVar4,
                     (allocator<char> *)((long)&rec_capsule_1.super_object.super_handle.m_ptr + 7));
          std::operator+(&local_408,"Cannot overload existing non-function object \"",&local_428);
          std::operator+(&local_3e8,&local_408,"\" with a function of the same name");
          pybind11_fail(&local_3e8);
        }
      }
      else {
        ppPVar5 = handle::ptr(&rec->sibling);
        if ((*(uint *)((*ppPVar5)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar5 = handle::ptr(&rec->sibling);
          local_720 = (*ppPVar5)[1].ob_type;
        }
        else {
          local_720 = (PyTypeObject *)0x0;
        }
        handle::handle(&local_3c8,(PyObject *)local_720);
        reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_3c0,local_3c8);
        chain_start = capsule::operator_cast_to_function_record_(&local_3c0);
        bVar2 = detail::object_api<pybind11::handle>::is
                          ((object_api<pybind11::handle> *)&chain_start->scope,
                           (object_api<pybind11::handle> *)&rec->scope);
        if (!bVar2) {
          chain_start = (function_record *)0x0;
        }
        capsule::~capsule(&local_3c0);
      }
    }
    if (chain_start == (function_record *)0x0) {
      pPVar10 = (PyMethodDef *)operator_new(0x20);
      *(undefined8 *)&pPVar10->ml_flags = 0;
      pPVar10->ml_doc = (char *)0x0;
      pPVar10->ml_name = (char *)0x0;
      pPVar10->ml_meth = (PyCFunction)0x0;
      rec->def = pPVar10;
      pPVar10 = rec->def;
      *(undefined8 *)&pPVar10->ml_flags = 0;
      pPVar10->ml_doc = (char *)0x0;
      pPVar10->ml_name = (char *)0x0;
      pPVar10->ml_meth = (PyCFunction)0x0;
      rec->def->ml_name = rec->name;
      rec->def->ml_meth = dispatcher;
      rec->def->ml_flags = 3;
      destructor = initialize_generic(pybind11::detail::function_record*,char_const*,std::type_info_const*const*,unsigned_long)
                   ::{lambda(void*)#1}::operator_cast_to_function_pointer
                             ((_lambda_void___1_ *)((long)&scope_module.super_handle.m_ptr + 7));
      capsule::capsule((capsule *)&local_438,rec,destructor);
      object::object((object *)&local_448);
      bVar2 = handle::operator_cast_to_bool(&rec->scope);
      if (bVar2) {
        local_450 = (rec->scope).m_ptr;
        bVar2 = hasattr((handle)local_450,"__module__");
        if (bVar2) {
          detail::object_api<pybind11::handle>::attr
                    (&local_478,(object_api<pybind11::handle> *)&rec->scope,"__module__");
          detail::accessor::operator_cast_to_object((accessor *)&local_458);
          object::operator=((object *)&local_448,&local_458);
          object::~object(&local_458);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_478);
        }
        else {
          local_480 = (rec->scope).m_ptr;
          bVar2 = hasattr((handle)local_480,"__name__");
          if (bVar2) {
            detail::object_api<pybind11::handle>::attr
                      (&local_4a8,(object_api<pybind11::handle> *)&rec->scope,"__name__");
            detail::accessor::operator_cast_to_object((accessor *)&local_488);
            object::operator=((object *)&local_448,&local_488);
            object::~object(&local_488);
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4a8);
          }
        }
      }
      pPVar10 = rec->def;
      ppPVar5 = handle::ptr(&local_438);
      pPVar11 = *ppPVar5;
      ppPVar5 = handle::ptr(&local_448);
      pPVar11 = (PyObject *)PyCMethod_New(pPVar10,pPVar11,*ppPVar5,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar11;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      object::~object((object *)&local_448);
      capsule::~capsule((capsule *)&local_438);
    }
    else {
      ppPVar5 = handle::ptr(&rec->sibling);
      (this->super_function).super_object.super_handle.m_ptr = *ppPVar5;
      handle::inc_ref((handle *)this);
      if (((byte)(*(ushort *)&chain_start->field_0x59 >> 4) & 1) !=
          ((byte)(*(ushort *)&rec->field_0x59 >> 4) & 1)) {
        pcVar4 = "static";
        if (((byte)rec->field_0x59 >> 4 & 1) != 0) {
          pcVar4 = "instance";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,pcVar4,&local_589);
        std::operator+(&local_568,
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                       ,&local_588);
        std::operator+(&local_548,&local_568," method ");
        detail::object_api<pybind11::handle>::attr
                  (&local_5d8,(object_api<pybind11::handle> *)&rec->scope,"__name__");
        str::str<pybind11::detail::accessor_policies::str_attr>(&local_5b8,&local_5d8);
        str::operator_cast_to_string(&local_5b0,&local_5b8);
        std::operator+(&local_528,&local_548,&local_5b0);
        std::operator+(&local_508,&local_528,".");
        pcVar4 = rec->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f8,pcVar4,
                   (allocator<char> *)((long)&rec_capsule_2.super_object.super_handle.m_ptr + 7));
        std::operator+(&local_4e8,&local_508,&local_5f8);
        std::operator+(&local_4c8,&local_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &type_index);
        pybind11_fail(&local_4c8);
      }
      if ((*(ushort *)&rec->field_0x59 >> 8 & 1) == 0) {
        rec_capsule.super_object.super_handle.m_ptr = (object)(object)chain_start;
        for (; chain_start->next != (function_record *)0x0; chain_start = chain_start->next) {
        }
        chain_start->next = rec;
      }
      else {
        rec->next = chain_start;
        rec_capsule.super_object.super_handle.m_ptr = (object)(object)rec;
        handle::handle((handle *)((long)&signatures.field_2 + 8),
                       (PyObject *)(this->super_function).super_object.super_handle.m_ptr[1].ob_type
                      );
        reinterpret_borrow<pybind11::capsule>
                  ((pybind11 *)&local_608,(handle)signatures.field_2._8_8_);
        capsule::set_pointer(&local_608,rec);
        capsule::~capsule(&local_608);
      }
    }
    std::__cxx11::string::string(local_630);
    it._4_4_ = 0;
    if ((chain_start != (function_record *)0x0) &&
       (bVar2 = options::show_function_signatures(), bVar2)) {
      std::__cxx11::string::operator+=(local_630,rec->name);
      std::__cxx11::string::operator+=(local_630,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_630,"Overloaded function.\n\n");
    }
    it._3_1_ = 1;
    for (local_640.m_ptr = (PyObject *)rec_capsule.super_object.super_handle.m_ptr;
        local_640.m_ptr != (PyObject *)0x0;
        local_640.m_ptr = (PyObject *)local_640.m_ptr[8].ob_refcnt) {
      bVar2 = options::show_function_signatures();
      if (bVar2) {
        if (0 < it._4_4_) {
          std::__cxx11::string::operator+=(local_630,"\n");
        }
        if (chain_start != (function_record *)0x0) {
          it._4_4_ = it._4_4_ + 1;
          std::__cxx11::to_string((string *)&func,it._4_4_);
          std::operator+(&local_660,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                         ". ");
          std::__cxx11::string::operator+=(local_630,(string *)&local_660);
          std::__cxx11::string::~string((string *)&local_660);
          std::__cxx11::string::~string((string *)&func);
        }
        std::__cxx11::string::operator+=(local_630,rec->name);
        std::__cxx11::string::operator+=(local_630,(char *)local_640.m_ptr[1].ob_refcnt);
        std::__cxx11::string::operator+=(local_630,"\n");
      }
      if ((((local_640.m_ptr)->ob_type != (PyTypeObject *)0x0) &&
          (sVar12 = strlen((char *)(local_640.m_ptr)->ob_type), sVar12 != 0)) &&
         (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
        bVar2 = options::show_function_signatures();
        if (!bVar2) {
          if ((it._3_1_ & 1) == 0) {
            std::__cxx11::string::operator+=(local_630,"\n");
          }
          else {
            it._3_1_ = 0;
          }
        }
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_630,"\n");
        }
        std::__cxx11::string::operator+=(local_630,(char *)(local_640.m_ptr)->ob_type);
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_630,"\n");
        }
      }
    }
    pPVar11 = (this->super_function).super_object.super_handle.m_ptr;
    if (*(long *)(pPVar11[1].ob_refcnt + 0x18) != 0) {
      free(*(void **)(pPVar11[1].ob_refcnt + 0x18));
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    *(char **)(pPVar11[1].ob_refcnt + 0x18) = pcVar4;
    if ((*(ushort *)&rec->field_0x59 >> 4 & 1) != 0) {
      pPVar13 = (PyObject *)
                PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
      (this->super_function).super_object.super_handle.m_ptr = pPVar13;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
      }
      _Py_DECREF(pPVar11);
    }
    std::__cxx11::string::~string(local_630);
    std::__cxx11::string::~string((string *)&type_index);
    return;
  }
  pybind11_fail("Internal error while parsing type signature (2)");
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(rec);
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = rec;
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }